

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::__fastunpack22_32(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar1 = *in;
  *out = uVar1 & 0x3fffff;
  out[1] = uVar1 >> 0x16;
  uVar2 = in[1];
  out[1] = uVar1 >> 0x16 | (uVar2 & 0xfff) << 10;
  out[2] = uVar2 >> 0xc;
  uVar1 = in[2];
  out[2] = uVar2 >> 0xc | (uVar1 & 3) << 0x14;
  out[3] = uVar1 >> 2 & 0x3fffff;
  out[4] = uVar1 >> 0x18;
  uVar2 = in[3];
  uVar3 = in[4];
  out[4] = uVar1 >> 0x18 | (uVar2 & 0x3fff) << 8;
  out[5] = uVar2 >> 0xe;
  out[5] = uVar2 >> 0xe | (uVar3 & 0xf) << 0x12;
  out[6] = uVar3 >> 4 & 0x3fffff;
  out[7] = uVar3 >> 0x1a;
  uVar1 = in[5];
  out[7] = uVar3 >> 0x1a | (uVar1 & 0xffff) << 6;
  uVar2 = in[6];
  out[8] = uVar1 >> 0x10;
  out[8] = uVar1 >> 0x10 | (uVar2 & 0x3f) << 0x10;
  uVar1 = in[7];
  out[9] = uVar2 >> 6 & 0x3fffff;
  out[10] = uVar2 >> 0x1c;
  out[10] = uVar2 >> 0x1c | (uVar1 & 0x3ffff) << 4;
  uVar2 = in[8];
  out[0xb] = uVar1 >> 0x12;
  out[0xb] = uVar1 >> 0x12 | (uVar2 & 0xff) << 0xe;
  out[0xc] = uVar2 >> 8 & 0x3fffff;
  uVar1 = in[9];
  out[0xd] = uVar2 >> 0x1e;
  out[0xd] = uVar2 >> 0x1e | (uVar1 & 0xfffff) << 2;
  out[0xe] = uVar1 >> 0x14;
  uVar2 = in[10];
  out[0xe] = uVar1 >> 0x14 | (uVar2 & 0x3ff) << 0xc;
  out[0xf] = uVar2 >> 10;
  uVar1 = in[0xb];
  out[0x10] = uVar1 & 0x3fffff;
  out[0x11] = uVar1 >> 0x16;
  uVar2 = in[0xc];
  out[0x11] = uVar1 >> 0x16 | (uVar2 & 0xfff) << 10;
  uVar1 = in[0xd];
  out[0x12] = uVar2 >> 0xc;
  out[0x12] = uVar2 >> 0xc | (uVar1 & 3) << 0x14;
  out[0x13] = uVar1 >> 2 & 0x3fffff;
  uVar2 = in[0xe];
  out[0x14] = uVar1 >> 0x18;
  out[0x14] = uVar1 >> 0x18 | (uVar2 & 0x3fff) << 8;
  out[0x15] = uVar2 >> 0xe;
  uVar1 = in[0xf];
  out[0x15] = uVar2 >> 0xe | (uVar1 & 0xf) << 0x12;
  out[0x16] = uVar1 >> 4 & 0x3fffff;
  out[0x17] = uVar1 >> 0x1a;
  uVar2 = in[0x10];
  out[0x17] = uVar1 >> 0x1a | (uVar2 & 0xffff) << 6;
  out[0x18] = uVar2 >> 0x10;
  uVar1 = in[0x11];
  out[0x18] = uVar2 >> 0x10 | (uVar1 & 0x3f) << 0x10;
  out[0x19] = uVar1 >> 6 & 0x3fffff;
  out[0x1a] = uVar1 >> 0x1c;
  uVar2 = in[0x12];
  out[0x1a] = uVar1 >> 0x1c | (uVar2 & 0x3ffff) << 4;
  uVar1 = in[0x13];
  out[0x1b] = uVar2 >> 0x12;
  out[0x1b] = uVar2 >> 0x12 | (uVar1 & 0xff) << 0xe;
  out[0x1c] = uVar1 >> 8 & 0x3fffff;
  uVar2 = in[0x14];
  out[0x1d] = uVar1 >> 0x1e;
  out[0x1d] = uVar1 >> 0x1e | (uVar2 & 0xfffff) << 2;
  out[0x1e] = uVar2 >> 0x14;
  uVar1 = in[0x15];
  out[0x1e] = uVar2 >> 0x14 | (uVar1 & 0x3ff) << 0xc;
  out[0x1f] = uVar1 >> 10;
  return in + 0x16;
}

Assistant:

const uint32_t *__fastunpack22_32(const uint32_t *__restrict__ in,
                                  uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 22);
  out++;
  *out = ((*in) >> 22);
  ++in;
  *out |= ((*in) % (1U << 12)) << (22 - 12);
  out++;
  *out = ((*in) >> 12);
  ++in;
  *out |= ((*in) % (1U << 2)) << (22 - 2);
  out++;
  *out = ((*in) >> 2) % (1U << 22);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 14)) << (22 - 14);
  out++;
  *out = ((*in) >> 14);
  ++in;
  *out |= ((*in) % (1U << 4)) << (22 - 4);
  out++;
  *out = ((*in) >> 4) % (1U << 22);
  out++;
  *out = ((*in) >> 26);
  ++in;
  *out |= ((*in) % (1U << 16)) << (22 - 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  *out |= ((*in) % (1U << 6)) << (22 - 6);
  out++;
  *out = ((*in) >> 6) % (1U << 22);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 18)) << (22 - 18);
  out++;
  *out = ((*in) >> 18);
  ++in;
  *out |= ((*in) % (1U << 8)) << (22 - 8);
  out++;
  *out = ((*in) >> 8) % (1U << 22);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 20)) << (22 - 20);
  out++;
  *out = ((*in) >> 20);
  ++in;
  *out |= ((*in) % (1U << 10)) << (22 - 10);
  out++;
  *out = ((*in) >> 10);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 22);
  out++;
  *out = ((*in) >> 22);
  ++in;
  *out |= ((*in) % (1U << 12)) << (22 - 12);
  out++;
  *out = ((*in) >> 12);
  ++in;
  *out |= ((*in) % (1U << 2)) << (22 - 2);
  out++;
  *out = ((*in) >> 2) % (1U << 22);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 14)) << (22 - 14);
  out++;
  *out = ((*in) >> 14);
  ++in;
  *out |= ((*in) % (1U << 4)) << (22 - 4);
  out++;
  *out = ((*in) >> 4) % (1U << 22);
  out++;
  *out = ((*in) >> 26);
  ++in;
  *out |= ((*in) % (1U << 16)) << (22 - 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  *out |= ((*in) % (1U << 6)) << (22 - 6);
  out++;
  *out = ((*in) >> 6) % (1U << 22);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 18)) << (22 - 18);
  out++;
  *out = ((*in) >> 18);
  ++in;
  *out |= ((*in) % (1U << 8)) << (22 - 8);
  out++;
  *out = ((*in) >> 8) % (1U << 22);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 20)) << (22 - 20);
  out++;
  *out = ((*in) >> 20);
  ++in;
  *out |= ((*in) % (1U << 10)) << (22 - 10);
  out++;
  *out = ((*in) >> 10);
  ++in;
  out++;

  return in;
}